

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void MergeUVRow_16_AVX2(uint16_t *src_u,uint16_t *src_v,uint16_t *dst_uv,int scale,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  int iVar8;
  undefined1 auVar9 [32];
  
  auVar4 = vpunpcklwd_avx(ZEXT416((uint)scale),ZEXT416((uint)scale));
  auVar9._0_4_ = auVar4._0_4_;
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = auVar9._0_4_;
  auVar9._12_4_ = auVar9._0_4_;
  auVar9._16_4_ = auVar9._0_4_;
  auVar9._20_4_ = auVar9._0_4_;
  auVar9._24_4_ = auVar9._0_4_;
  auVar9._28_4_ = auVar9._0_4_;
  lVar7 = (long)src_v - (long)src_u;
  do {
    auVar2 = *(undefined1 (*) [32])src_u;
    pauVar1 = (undefined1 (*) [32])((long)src_u + lVar7);
    src_u = (uint16_t *)((long)src_u + 0x20);
    auVar2 = vpmullw_avx2(auVar2,auVar9);
    auVar5 = vpmullw_avx2(*pauVar1,auVar9);
    auVar6 = vpunpcklwd_avx2(auVar2,auVar5);
    auVar2 = vpunpckhwd_avx2(auVar2,auVar5);
    *(undefined1 (*) [16])dst_uv = auVar6._0_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x10) = auVar2._0_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x20) = auVar6._16_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x30) = auVar2._16_16_;
    dst_uv = (uint16_t *)((long)dst_uv + 0x40);
    iVar8 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar3);
  return;
}

Assistant:

void MergeUVRow_16_AVX2(const uint16_t* src_u,
                        const uint16_t* src_v,
                        uint16_t* dst_uv,
                        int scale,
                        int width) {
  // clang-format off
  asm volatile (
      "vmovd       %4,%%xmm3                     \n"
      "vpunpcklwd  %%xmm3,%%xmm3,%%xmm3          \n"
      "vbroadcastss %%xmm3,%%ymm3                \n"
      "sub         %0,%1                         \n"

    // 16 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     (%0,%1,1),%%ymm1              \n"
      "add         $0x20,%0                      \n"

      "vpmullw     %%ymm3,%%ymm0,%%ymm0          \n"
      "vpmullw     %%ymm3,%%ymm1,%%ymm1          \n"
      "vpunpcklwd  %%ymm1,%%ymm0,%%ymm2          \n"  // mutates
      "vpunpckhwd  %%ymm1,%%ymm0,%%ymm0          \n"
      "vextractf128 $0x0,%%ymm2,(%2)             \n"
      "vextractf128 $0x0,%%ymm0,0x10(%2)         \n"
      "vextractf128 $0x1,%%ymm2,0x20(%2)         \n"
      "vextractf128 $0x1,%%ymm0,0x30(%2)         \n"
      "add         $0x40,%2                      \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : "+r"(src_u),   // %0
    "+r"(src_v),   // %1
    "+r"(dst_uv),  // %2
    "+r"(width)    // %3
  : "r"(scale)     // %4
  : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3");
  // clang-format on
}